

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<fmt::v5::internal::width_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>>
               (width_checker<fmt::v5::internal::error_handler> *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
               *arg)

{
  basic_string_view<char> bVar1;
  handle hVar2;
  custom_value<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
  *in_RSI;
  width_checker<fmt::v5::internal::error_handler> *in_RDI;
  undefined2 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8a;
  uint in_stack_ffffffffffffff8c;
  bool bVar3;
  undefined2 in_stack_ffffffffffffff90;
  undefined6 in_stack_ffffffffffffff92;
  handle local_38;
  basic_string_view<char> local_28 [2];
  type_conflict local_8;
  
  bVar3 = SUB41(in_stack_ffffffffffffff8c >> 0x18,0);
  switch(*(undefined4 *)&in_RSI[1].value) {
  case 0:
  default:
switchD_002868f8_default:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()(in_RDI);
    break;
  case 1:
    goto switchD_002868f8_default;
  case 2:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff8c);
    break;
  case 3:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                         in_stack_ffffffffffffff8c);
    break;
  case 4:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                         CONCAT44(in_stack_ffffffffffffff8c,
                                  CONCAT22(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88)));
    break;
  case 5:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                         CONCAT44(in_stack_ffffffffffffff8c,
                                  CONCAT22(in_stack_ffffffffffffff8a,in_stack_ffffffffffffff88)));
    break;
  case 6:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),bVar3);
    break;
  case 7:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),bVar3);
    break;
  case 8:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                         (double)CONCAT44(in_stack_ffffffffffffff8c,
                                          CONCAT22(in_stack_ffffffffffffff8a,
                                                   in_stack_ffffffffffffff88)));
    break;
  case 9:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,
                                  (short)((unkuint10)*(unkbyte10 *)in_RSI >> 0x40)),
                         (longdouble)CONCAT28((short)*(unkbyte10 *)in_RSI,0x2869e8));
    break;
  case 10:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                         (char *)CONCAT44(in_stack_ffffffffffffff8c,
                                          CONCAT22(in_stack_ffffffffffffff8a,
                                                   in_stack_ffffffffffffff88)));
    break;
  case 0xb:
    basic_string_view<char>::basic_string_view
              (local_28,(char *)in_RSI->value,(size_t)in_RSI->format);
    bVar1.data_._2_2_ = in_stack_ffffffffffffff8a;
    bVar1.data_._0_2_ = in_stack_ffffffffffffff88;
    bVar1.data_._4_4_ = in_stack_ffffffffffffff8c;
    bVar1.size_._0_2_ = in_stack_ffffffffffffff90;
    bVar1.size_._2_6_ = in_stack_ffffffffffffff92;
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)0x286a47,bVar1);
    break;
  case 0xc:
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)
                         CONCAT62(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90),
                         (void *)CONCAT44(in_stack_ffffffffffffff8c,
                                          CONCAT22(in_stack_ffffffffffffff8a,
                                                   in_stack_ffffffffffffff88)));
    break;
  case 0xd:
    basic_format_arg<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>_>
    ::handle::handle(&local_38,*in_RSI);
    hVar2.custom_.value._2_2_ = in_stack_ffffffffffffff8a;
    hVar2.custom_.value._0_2_ = in_stack_ffffffffffffff88;
    hVar2.custom_.value._4_4_ = in_stack_ffffffffffffff8c;
    hVar2.custom_.format._0_2_ = in_stack_ffffffffffffff90;
    hVar2.custom_.format._2_6_ = in_stack_ffffffffffffff92;
    local_8 = internal::width_checker<fmt::v5::internal::error_handler>::operator()
                        ((width_checker<fmt::v5::internal::error_handler> *)0x286aaf,hVar2);
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}